

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int string_buffer_putc8(StringBuffer *s,uint32_t c)

{
  int iVar1;
  undefined2 in_SI;
  long in_RDI;
  int in_stack_00000010;
  int in_stack_00000014;
  StringBuffer *in_stack_00000018;
  int local_4;
  
  if ((*(int *)(in_RDI + 0x10) < *(int *)(in_RDI + 0x14)) ||
     (iVar1 = string_buffer_realloc(in_stack_00000018,in_stack_00000014,in_stack_00000010),
     iVar1 == 0)) {
    if (*(int *)(in_RDI + 0x18) == 0) {
      iVar1 = *(int *)(in_RDI + 0x10);
      *(int *)(in_RDI + 0x10) = iVar1 + 1;
      *(char *)(*(long *)(in_RDI + 8) + 0x10 + (long)iVar1) = (char)in_SI;
    }
    else {
      iVar1 = *(int *)(in_RDI + 0x10);
      *(int *)(in_RDI + 0x10) = iVar1 + 1;
      *(undefined2 *)(*(long *)(in_RDI + 8) + 0x10 + (long)iVar1 * 2) = in_SI;
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int string_buffer_putc8(StringBuffer *s, uint32_t c)
{
    if (unlikely(s->len >= s->size)) {
        if (string_buffer_realloc(s, s->len + 1, c))
            return -1;
    }
    if (s->is_wide_char) {
        s->str->u.str16[s->len++] = c;
    } else {
        s->str->u.str8[s->len++] = c;
    }
    return 0;
}